

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

OpCode __thiscall
ParamEntry::assumedExtension(ParamEntry *this,Address *addr,int4 sz,VarnodeData *res)

{
  int iVar1;
  int4 iVar2;
  uint4 uVar3;
  OpCode OVar4;
  uintb uVar5;
  
  OVar4 = CPUI_COPY;
  if ((this->flags & 0x2c) != 0) {
    iVar1 = this->alignment;
    if (iVar1 == 0) {
      iVar1 = this->size;
    }
    if (((sz < iVar1) && (this->joinrec == (JoinRecord *)0x0)) &&
       (iVar2 = justifiedContain(this,addr,sz), iVar2 == 0)) {
      uVar3 = this->alignment;
      if ((long)(int)uVar3 == 0) {
        uVar5 = this->addressbase;
        uVar3 = this->size;
      }
      else {
        uVar5 = addr->offset -
                (long)(int)((addr->offset - this->addressbase) % (ulong)(long)(int)uVar3);
      }
      res->space = this->spaceid;
      res->offset = uVar5;
      res->size = uVar3;
      OVar4 = CPUI_INT_ZEXT;
      if ((this->flags & 4) == 0) {
        OVar4 = CPUI_PIECE;
        if ((this->flags & 0x20) == 0) {
          OVar4 = CPUI_INT_SEXT;
        }
      }
    }
  }
  return OVar4;
}

Assistant:

OpCode ParamEntry::assumedExtension(const Address &addr,int4 sz,VarnodeData &res) const

{
  if ((flags & (smallsize_zext|smallsize_sext|smallsize_inttype))==0) return CPUI_COPY;
  if (alignment != 0) {
    if (sz >= alignment)
      return CPUI_COPY;
  }
  else if (sz >= size)
    return CPUI_COPY;
  if (joinrec != (JoinRecord *)0) return CPUI_COPY;
  if (justifiedContain(addr,sz)!=0) return CPUI_COPY; // (addr,sz) is not justified properly to allow an extension
  if (alignment == 0) {	// If exclusion, take up the whole entry
    res.space = spaceid;
    res.offset = addressbase;
    res.size = size;
  }
  else {	// Otherwise take up whole alignment
    res.space = spaceid;
    int4 alignAdjust = (addr.getOffset() - addressbase) % alignment;
    res.offset = addr.getOffset() - alignAdjust;
    res.size = alignment;
  }
  if ((flags & smallsize_zext)!=0)
    return CPUI_INT_ZEXT;
  if ((flags & smallsize_inttype)!=0)
    return CPUI_PIECE;
  return CPUI_INT_SEXT;
}